

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Expr.h
# Opt level: O0

void __thiscall
enact::ReferenceExpr::ReferenceExpr
          (ReferenceExpr *this,unique_ptr<enact::Expr,_std::default_delete<enact::Expr>_> *expr,
          Token *oper,optional<enact::Token> *permission,optional<enact::Token> *region)

{
  optional<enact::Token> *region_local;
  optional<enact::Token> *permission_local;
  Token *oper_local;
  unique_ptr<enact::Expr,_std::default_delete<enact::Expr>_> *expr_local;
  ReferenceExpr *this_local;
  
  Expr::Expr(&this->super_Expr);
  (this->super_Expr)._vptr_Expr = (_func_int **)&PTR__ReferenceExpr_0016a648;
  std::unique_ptr<enact::Expr,_std::default_delete<enact::Expr>_>::unique_ptr(&this->expr,expr);
  Token::Token(&this->oper,oper);
  std::optional<enact::Token>::optional(&this->permission,permission);
  std::optional<enact::Token>::optional(&this->region,region);
  return;
}

Assistant:

ReferenceExpr(
                std::unique_ptr<Expr> expr,
                Token oper,
                std::optional<Token> permission,
                std::optional<Token> region) :
                expr{std::move(expr)},
                oper{std::move(oper)},
                permission{std::move(permission)},
                region{std::move(region)} {}